

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Int(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      *this,int i)

{
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  Prefix(this,kNumberType);
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->os_->stack_,0xb);
  if (pcVar2 == (char *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/rapidjson/internal/itoa.h"
                  ,0x74,"char *rapidjson::internal::i32toa(int32_t, char *)");
  }
  pcVar4 = pcVar2;
  if (i < 0) {
    *pcVar2 = '-';
    i = -i;
    pcVar4 = pcVar2 + 1;
  }
  pcVar3 = internal::u32toa(i,pcVar4);
  pGVar1 = this->os_;
  pcVar4 = (pGVar1->stack_).stackTop_;
  if ((ulong)((long)pcVar4 - (long)(pGVar1->stack_).stack_) < ((long)pcVar2 - (long)pcVar3) + 0xbU)
  {
    __assert_fail("GetSize() >= count * sizeof(T)",
                  "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/rapidjson/internal/stack.h"
                  ,0x8b,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                 );
  }
  (pGVar1->stack_).stackTop_ = pcVar4 + (-0xb - ((long)pcVar2 - (long)pcVar3));
  return true;
}

Assistant:

bool Int(int i)             { Prefix(kNumberType); return EndValue(WriteInt(i)); }